

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

void dumpStdConnTable(FILE *outf)

{
  StdResConnTableEntry_t *local_20;
  StdResConnTableEntry_t *t;
  int h;
  FILE *outf_local;
  
  for (t._4_4_ = 0; (int)t._4_4_ < 0xa39; t._4_4_ = t._4_4_ + 1) {
    fprintf((FILE *)outf,"%5d] ",(ulong)t._4_4_);
    for (local_20 = StdResTblBucket[(int)t._4_4_]; local_20 != (StdResConnTableEntry_t *)0x0;
        local_20 = local_20->next) {
      fprintf((FILE *)outf,"(\"%s\" --> \"%s\") ",local_20->key,local_20->value);
    }
    fprintf((FILE *)outf,"\n");
  }
  return;
}

Assistant:

void dumpStdConnTable(FILE * outf) {
   int h;
   StdResConnTableEntry_t *t;

   for (h = 0; h < M; h++) {
      fprintf(outf, "%5d] ", h);
      for (t = StdResTblBucket[h]; t; t = t->next) {
	 fprintf(outf, "(\"%s\" --> \"%s\") ", t->key, t->value);
      }
      fprintf(outf, "\n");
   }
}